

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMInteractionType.hpp
# Opt level: O3

void __thiscall
OpenMD::EAMInteractionType::EAMInteractionType
          (EAMInteractionType *this,RealType re,RealType alpha,RealType A,RealType Ci,RealType Cj)

{
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__EAMInteractionType_002f9920;
  (this->phi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->phi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->phi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->interactionType_ = eamitOxides;
  NonBondedInteractionType::setEAMOxides(&this->super_NonBondedInteractionType);
  this->re_ = re;
  this->alpha_ = alpha;
  this->A_ = A;
  this->Ci_ = Ci;
  this->Cj_ = Cj;
  return;
}

Assistant:

EAMInteractionType(RealType re, RealType alpha, RealType A, RealType Ci,
                       RealType Cj) {
      interactionType_ = eamitOxides;
      setEAMOxides();
      re_    = re;
      alpha_ = alpha;
      A_     = A;
      Ci_    = Ci;
      Cj_    = Cj;
    }